

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

Token * __thiscall TokenStream::lookahead(Token *__return_storage_ptr__,TokenStream *this)

{
  unsigned_long_long uVar1;
  char cVar2;
  undefined3 uVar3;
  Token *pTVar4;
  
  if ((this->stash).super__Optional_base<Token,_true,_true>._M_payload.
      super__Optional_payload_base<Token>._M_engaged == true) {
    pTVar4 = std::optional<Token>::value(&this->stash);
    uVar1 = (pTVar4->span).end;
    (__return_storage_ptr__->span).begin = (pTVar4->span).begin;
    (__return_storage_ptr__->span).end = uVar1;
    cVar2 = pTVar4->value;
    uVar3 = *(undefined3 *)&pTVar4->field_0x15;
    __return_storage_ptr__->type = pTVar4->type;
    __return_storage_ptr__->value = cVar2;
    *(undefined3 *)&__return_storage_ptr__->field_0x15 = uVar3;
  }
  else {
    std::function<Token_()>::operator()(__return_storage_ptr__,&this->supplier);
    *(undefined8 *)
     ((long)&(this->stash).super__Optional_base<Token,_true,_true>._M_payload.
             super__Optional_payload_base<Token>._M_payload + 0x10) =
         *(undefined8 *)&__return_storage_ptr__->type;
    uVar1 = (__return_storage_ptr__->span).end;
    (this->stash).super__Optional_base<Token,_true,_true>._M_payload.
    super__Optional_payload_base<Token>._M_payload._M_value.span.begin =
         (__return_storage_ptr__->span).begin;
    (this->stash).super__Optional_base<Token,_true,_true>._M_payload.
    super__Optional_payload_base<Token>._M_payload._M_value.span.end = uVar1;
    (this->stash).super__Optional_base<Token,_true,_true>._M_payload.
    super__Optional_payload_base<Token>._M_engaged = true;
  }
  return __return_storage_ptr__;
}

Assistant:

auto TokenStream::lookahead() -> Token {
    if (stash)
        return stash.value();

    auto token = supplier();
    stash.emplace(token);
    return token;
}